

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpersTest.cpp
# Opt level: O2

void __thiscall
Types_LexicalCastDouble_Test::~Types_LexicalCastDouble_Test(Types_LexicalCastDouble_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Types, LexicalCastDouble) {
    std::string input = "9.12";
    long double x;
    EXPECT_TRUE(CLI::detail::lexical_cast(input, x));
    EXPECT_FLOAT_EQ((float)9.12, (float)x);

    std::string bad_input = "hello";
    EXPECT_FALSE(CLI::detail::lexical_cast(bad_input, x));

    std::string overflow_input = "1" + std::to_string(LDBL_MAX);
    EXPECT_FALSE(CLI::detail::lexical_cast(overflow_input, x));
}